

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

Blob * jbcoin::serialize_ec_point(Blob *__return_storage_ptr__,ec_point *point)

{
  ec_point *point_00;
  reference ptr;
  allocator<unsigned_char> local_1a;
  undefined1 local_19;
  ec_point *local_18;
  ec_point *point_local;
  Blob *result;
  
  local_19 = 0;
  local_18 = point;
  point_local = (ec_point *)__return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_1a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x21,&local_1a);
  std::allocator<unsigned_char>::~allocator(&local_1a);
  point_00 = local_18;
  ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (__return_storage_ptr__,0);
  openssl::serialize_ec_point(point_00,ptr);
  return __return_storage_ptr__;
}

Assistant:

static Blob serialize_ec_point (ec_point const& point)
{
    Blob result (33);

    serialize_ec_point (point, &result[0]);

    return result;
}